

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorCheckClasses.cpp
# Opt level: O2

void __thiscall
GdlAttrValueSpec::FlattenPointSlotAttrs
          (GdlAttrValueSpec *this,GrcManager *pcman,
          vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_> *vpavsNew)

{
  GrcSymbolTableEntry *pGVar1;
  GdlExpression *pexpValue;
  _Alloc_hider pexpValue_00;
  bool bVar2;
  __type _Var3;
  __type _Var4;
  int iVar5;
  Symbol pGVar6;
  Symbol pGVar7;
  Symbol pGVar8;
  GdlAttrValueSpec *pGVar9;
  long lVar10;
  string *this_00;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  GdlAttrValueSpec *pavs;
  GdlExpression *pexpYoffset;
  GdlExpression *pexpGpoint;
  GdlExpression *pexpXoffset;
  GdlExpression *pexpY;
  int nTmp;
  Symbol local_250;
  Symbol local_248;
  Symbol local_240;
  Symbol local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar2 = GrcSymbolTableEntry::IsBogusSlotAttr(this->m_psymName);
  if (bVar2) {
    pGVar6 = this->m_psymName;
    std::__cxx11::string::string((string *)&local_230,"xoffset",(allocator *)&pexpY);
    _Var3 = std::operator==(&pGVar6->m_staFieldName,&local_230);
    if (_Var3) {
LAB_00123377:
      iVar5 = (*this->m_pexpValue->_vptr_GdlExpression[7])(this->m_pexpValue,&nTmp,0);
      if ((char)iVar5 != '\0') {
        bVar2 = nTmp == 0;
        if (!_Var3) goto LAB_0012349e;
        goto LAB_001234ab;
      }
      if (!_Var3) goto LAB_0012349b;
      std::__cxx11::string::~string((string *)&local_230);
    }
    else {
      pGVar6 = this->m_psymName;
      std::__cxx11::string::string((string *)&local_50,"yoffset",(allocator *)&pexpGpoint);
      _Var4 = std::operator==(&pGVar6->m_staFieldName,&local_50);
      if (_Var4) goto LAB_00123377;
LAB_0012349b:
      bVar2 = false;
LAB_0012349e:
      std::__cxx11::string::~string((string *)&local_50);
LAB_001234ab:
      std::__cxx11::string::~string((string *)&local_230);
      if (bVar2) goto LAB_00123522;
    }
    std::__cxx11::string::string((string *)&local_70,"Invalid slot attribute: ",(allocator *)&pexpY)
    ;
    GrcSymbolTableEntry::FullName_abi_cxx11_(&local_90,this->m_psymName);
    GrcErrorList::AddError(&g_errorList,0x1025,&this->super_GdlObject,&local_70,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    this_00 = &local_70;
  }
  else {
    bVar2 = GrcSymbolTableEntry::FitsSymbolType(this->m_psymName,ksymtSlotAttrPtOff);
    if (((!bVar2) &&
        (bVar2 = GrcSymbolTableEntry::FitsSymbolType(this->m_psymName,ksymtSlotAttrPt), !bVar2)) ||
       (bVar2 = GrcSymbolTableEntry::IsReadOnlySlotAttr(this->m_psymName), bVar2)) {
      _nTmp = (pointer)this;
      std::vector<GdlAttrValueSpec*,std::allocator<GdlAttrValueSpec*>>::
      emplace_back<GdlAttrValueSpec*>
                ((vector<GdlAttrValueSpec*,std::allocator<GdlAttrValueSpec*>> *)vpavsNew,
                 (GdlAttrValueSpec **)&nTmp);
      return;
    }
    GrcSymbolTableEntry::FullName_abi_cxx11_((string *)&nTmp,this->m_psymOperator);
    bVar2 = std::operator!=((string *)&nTmp,"=");
    std::__cxx11::string::~string((string *)&nTmp);
    if (bVar2) {
      std::__cxx11::string::string
                ((string *)&local_b0,
                 "Invalid point arithmetic; fields must be calculated independently in order to use "
                 ,(allocator *)&nTmp);
      GrcSymbolTableEntry::FullName_abi_cxx11_(&local_d0,this->m_psymOperator);
      GrcErrorList::AddError(&g_errorList,0x1026,&this->super_GdlObject,&local_b0,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      return;
    }
    pGVar1 = this->m_psymName;
    std::__cxx11::string::string((string *)&local_f0,"x",(allocator *)&nTmp);
    pGVar6 = GrcSymbolTableEntry::SubField(pGVar1,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    pGVar1 = this->m_psymName;
    std::__cxx11::string::string((string *)&local_110,"y",(allocator *)&nTmp);
    local_238 = GrcSymbolTableEntry::SubField(pGVar1,&local_110);
    std::__cxx11::string::~string((string *)&local_110);
    pGVar1 = this->m_psymName;
    std::__cxx11::string::string((string *)&local_130,"gpoint",(allocator *)&nTmp);
    local_240 = GrcSymbolTableEntry::SubField(pGVar1,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    pGVar1 = this->m_psymName;
    std::__cxx11::string::string((string *)&local_150,"xoffset",(allocator *)&nTmp);
    pGVar7 = GrcSymbolTableEntry::SubField(pGVar1,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    pGVar1 = this->m_psymName;
    std::__cxx11::string::string((string *)&local_170,"yoffset",(allocator *)&nTmp);
    pGVar8 = GrcSymbolTableEntry::SubField(pGVar1,&local_170);
    std::__cxx11::string::~string((string *)&local_170);
    GrcSymbolTableEntry::FitsSymbolType(this->m_psymName,ksymtSlotAttrPtOff);
    _nTmp = (pointer)0x0;
    pexpY = (GdlExpression *)0x0;
    pexpGpoint = (GdlExpression *)0x0;
    pexpXoffset = (GdlExpression *)0x0;
    pexpYoffset = (GdlExpression *)0x0;
    iVar5 = (*this->m_pexpValue->_vptr_GdlExpression[0x14])(this->m_pexpValue,pcman);
    pexpValue_00._M_p = _nTmp;
    if ((char)iVar5 == '\0') {
      std::__cxx11::string::string
                ((string *)&local_190,"Invalid point arithmetic",(allocator *)&pavs);
      GrcErrorList::AddError(&g_errorList,0x1027,&this->super_GdlObject,&local_190);
      this_00 = &local_190;
    }
    else {
      auVar12._8_8_ = pexpYoffset;
      auVar12._0_8_ = pexpGpoint;
      auVar13._8_8_ = pexpY;
      auVar13._0_8_ = _nTmp;
      auVar13 = auVar13 | auVar12;
      auVar11._0_4_ = -(uint)(auVar13._0_4_ == 0);
      auVar11._4_4_ = -(uint)(auVar13._4_4_ == 0);
      auVar11._8_4_ = -(uint)(auVar13._8_4_ == 0);
      auVar11._12_4_ = -(uint)(auVar13._12_4_ == 0);
      iVar5 = movmskps(iVar5,auVar11);
      local_250 = pGVar7;
      local_248 = pGVar8;
      if (iVar5 != 0xf) {
        if ((GdlAttrValueSpec *)_nTmp != (GdlAttrValueSpec *)0x0) {
          pGVar9 = (GdlAttrValueSpec *)operator_new(0x48);
          GdlAttrValueSpec(pGVar9,pGVar6,this->m_psymOperator,(GdlExpression *)pexpValue_00._M_p);
          pavs = pGVar9;
          GrpLineAndFile::operator=((GrpLineAndFile *)pGVar9,(GrpLineAndFile *)this);
          pavs->m_fFlattened = true;
          std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::push_back
                    (vpavsNew,&pavs);
        }
        pexpValue = pexpY;
        if (pexpY != (GdlExpression *)0x0) {
          pGVar9 = (GdlAttrValueSpec *)operator_new(0x48);
          GdlAttrValueSpec(pGVar9,local_238,this->m_psymOperator,pexpValue);
          pavs = pGVar9;
          GrpLineAndFile::operator=((GrpLineAndFile *)pGVar9,(GrpLineAndFile *)this);
          pavs->m_fFlattened = true;
          std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::push_back
                    (vpavsNew,&pavs);
        }
        pGVar8 = local_240;
        pGVar7 = local_248;
        pGVar6 = local_250;
        if (g_cman.m_fOffsetAttrs == true) {
          if (pexpGpoint != (GdlExpression *)0x0) {
            bVar2 = GrcSymbolTableEntry::IsBogusSlotAttr(local_240);
            if (bVar2) {
              if (pexpGpoint != (GdlExpression *)0x0) {
                (*pexpGpoint->_vptr_GdlExpression[2])();
              }
            }
            else {
              pGVar9 = (GdlAttrValueSpec *)operator_new(0x48);
              GdlAttrValueSpec(pGVar9,pGVar8,this->m_psymOperator,pexpGpoint);
              pavs = pGVar9;
              GrpLineAndFile::operator=((GrpLineAndFile *)pGVar9,(GrpLineAndFile *)this);
              pavs->m_fFlattened = true;
              std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::push_back
                        (vpavsNew,&pavs);
            }
          }
          if (pexpXoffset != (GdlExpression *)0x0) {
            bVar2 = GrcSymbolTableEntry::IsBogusSlotAttr(pGVar6);
            if (bVar2) {
              if (pexpXoffset != (GdlExpression *)0x0) {
                (*pexpXoffset->_vptr_GdlExpression[2])();
              }
            }
            else {
              pGVar9 = (GdlAttrValueSpec *)operator_new(0x48);
              GdlAttrValueSpec(pGVar9,pGVar6,this->m_psymOperator,pexpXoffset);
              pavs = pGVar9;
              GrpLineAndFile::operator=((GrpLineAndFile *)pGVar9,(GrpLineAndFile *)this);
              pavs->m_fFlattened = true;
              std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::push_back
                        (vpavsNew,&pavs);
            }
          }
          if (pexpYoffset == (GdlExpression *)0x0) goto LAB_00123522;
          bVar2 = GrcSymbolTableEntry::IsBogusSlotAttr(pGVar7);
          if (!bVar2) {
            pGVar9 = (GdlAttrValueSpec *)operator_new(0x48);
            GdlAttrValueSpec(pGVar9,pGVar7,this->m_psymOperator,pexpYoffset);
            pavs = pGVar9;
            GrpLineAndFile::operator=((GrpLineAndFile *)pGVar9,(GrpLineAndFile *)this);
            pavs->m_fFlattened = true;
            std::vector<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>::push_back
                      (vpavsNew,&pavs);
            goto LAB_00123522;
          }
        }
        else {
          if (pexpGpoint != (GdlExpression *)0x0) {
            (*pexpGpoint->_vptr_GdlExpression[2])();
          }
          if (pexpXoffset != (GdlExpression *)0x0) {
            (*pexpXoffset->_vptr_GdlExpression[2])();
          }
        }
        if (pexpYoffset != (GdlExpression *)0x0) {
          (*pexpYoffset->_vptr_GdlExpression[2])();
        }
        goto LAB_00123522;
      }
      lVar10 = __dynamic_cast(this->m_pexpValue,&GdlExpression::typeinfo,
                              &GdlLookupExpression::typeinfo,0);
      bVar2 = GrcSymbolTableEntry::FitsSymbolType
                        (*(GrcSymbolTableEntry **)(lVar10 + 0x38),ksymtGlyphAttr);
      if (bVar2) {
        std::__cxx11::string::string
                  ((string *)&local_1b0,"Glyph attribute is not a point: ",(allocator *)&pavs);
        GrcSymbolTableEntry::FullName_abi_cxx11_
                  (&local_1d0,*(GrcSymbolTableEntry **)(lVar10 + 0x38));
        GrcErrorList::AddError(&g_errorList,0x1028,&this->super_GdlObject,&local_1b0,&local_1d0);
        std::__cxx11::string::~string((string *)&local_1d0);
        this_00 = &local_1b0;
      }
      else {
        std::__cxx11::string::string
                  ((string *)&local_1f0,"Undefined glyph attribute: ",(allocator *)&pavs);
        GrcSymbolTableEntry::FullName_abi_cxx11_
                  (&local_210,*(GrcSymbolTableEntry **)(lVar10 + 0x38));
        GrcErrorList::AddError(&g_errorList,0x1029,&this->super_GdlObject,&local_1f0,&local_210);
        std::__cxx11::string::~string((string *)&local_210);
        this_00 = &local_1f0;
      }
    }
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_00123522:
  ~GdlAttrValueSpec(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

void GdlAttrValueSpec::FlattenPointSlotAttrs(GrcManager * pcman,
	std::vector<GdlAttrValueSpec *> & vpavsNew)
{
	if (m_psymName->IsBogusSlotAttr())	// eg, shift.gpath
	{
		int nTmp;
		if ((m_psymName->LastFieldIs("xoffset") || m_psymName->LastFieldIs("yoffset")) &&
			m_pexpValue->ResolveToInteger(&nTmp, false) && nTmp == 0)
		{	// ignore
		}
		else
			g_errorList.AddError(4133, this,
				"Invalid slot attribute: ",
				m_psymName->FullName());
		delete this;
	}
	else if (m_psymName->FitsSymbolType(ksymtSlotAttrPtOff)		// attach.at, shift, etc.
		|| m_psymName->FitsSymbolType(ksymtSlotAttrPt))			// collision.min/max
	{
		if (m_psymName->IsReadOnlySlotAttr())
		{
			//	Eventually will produce an error--for now, just pass through as is.
			vpavsNew.push_back(this);
			return;
		}

		if (m_psymOperator->FullName() != "=")
		{
			//	Can't use +=, -= with entire points.
			g_errorList.AddError(4134, this,
				"Invalid point arithmetic; fields must be calculated independently in order to use ",
				m_psymOperator->FullName());
			return;
		}

		Symbol psymX = m_psymName->SubField("x");
		Symbol psymY = m_psymName->SubField("y");
		Symbol psymGpoint = m_psymName->SubField("gpoint");
		Symbol psymXoffset = m_psymName->SubField("xoffset");
		Symbol psymYoffset = m_psymName->SubField("yoffset");
		Assert(psymX);
		Assert(psymY);
		if (m_psymName->FitsSymbolType(ksymtSlotAttrPtOff))
		{
			Assert(psymGpoint);
			Assert(psymXoffset);
			Assert(psymYoffset);
		}
		else
		{
			Assert(psymGpoint == NULL);
			Assert(psymXoffset == NULL);
			Assert(psymYoffset == NULL);
		}

		GdlExpression * pexpX = NULL;
		GdlExpression * pexpY = NULL;
		GdlExpression * pexpGpoint = NULL;
		GdlExpression * pexpXoffset = NULL;
		GdlExpression * pexpYoffset = NULL;

		bool fExpOkay = m_pexpValue->PointFieldEquivalents(pcman,
			&pexpX, &pexpY, &pexpGpoint, &pexpXoffset, &pexpYoffset);
		if (!fExpOkay)
		{
			g_errorList.AddError(4135, this,
				"Invalid point arithmetic");
			delete this;
			return;
		}
		else if (!pexpX && !pexpY && !pexpGpoint && !pexpYoffset && !pexpYoffset)
		{
			GdlLookupExpression * pexpLookup =
				dynamic_cast<GdlLookupExpression *>(m_pexpValue);
			Assert(pexpLookup);
			if (pexpLookup->Name()->FitsSymbolType(ksymtGlyphAttr))
				g_errorList.AddError(4136, this,
					"Glyph attribute is not a point: ",
					pexpLookup->Name()->FullName());
			else
				g_errorList.AddError(4137, this,
					"Undefined glyph attribute: ",
					pexpLookup->Name()->FullName());
			delete this;
			return;
		}
		
		GdlAttrValueSpec * pavs;
		if (pexpX)
		{
			pavs = new GdlAttrValueSpec(psymX, m_psymOperator, pexpX);
			pavs->CopyLineAndFile(*this);
			pavs->SetFlattened(true);
			vpavsNew.push_back(pavs);
		}
		if (pexpY)
		{
			pavs = new GdlAttrValueSpec(psymY, m_psymOperator, pexpY);
			pavs->CopyLineAndFile(*this);
			pavs->SetFlattened(true);
			vpavsNew.push_back(pavs);
		}
		if (g_cman.OffsetAttrs())
		{
			if (pexpGpoint)
			{
				if (psymGpoint->IsBogusSlotAttr())
					delete pexpGpoint;
				else
				{
					pavs = new GdlAttrValueSpec(psymGpoint, m_psymOperator, pexpGpoint);
					pavs->CopyLineAndFile(*this);
					pavs->SetFlattened(true);
					vpavsNew.push_back(pavs);
				}
			}
			if (pexpXoffset)
			{
				if (psymXoffset->IsBogusSlotAttr())
					delete pexpXoffset;
				else
				{
					pavs = new GdlAttrValueSpec(psymXoffset, m_psymOperator, pexpXoffset);
					pavs->CopyLineAndFile(*this);
					pavs->SetFlattened(true);
					vpavsNew.push_back(pavs);
				}
			}
			if (pexpYoffset)
			{
				if (psymYoffset->IsBogusSlotAttr())
					delete pexpYoffset;
				else
				{
					pavs = new GdlAttrValueSpec(psymYoffset, m_psymOperator, pexpYoffset);
					pavs->CopyLineAndFile(*this);
					pavs->SetFlattened(true);
					vpavsNew.push_back(pavs);
				}
			}
		} else {
			if (pexpGpoint)
				delete pexpGpoint;
			if (pexpXoffset)
				delete pexpXoffset;
			if (pexpYoffset)
				delete pexpYoffset;
		}

		delete this;	// replaced
	}
	else
		vpavsNew.push_back(this);
}